

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O3

int __thiscall HevcSpsUnit::scaling_list_data(HevcSpsUnit *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  
  uVar5 = 0;
  uVar4 = 1;
  do {
    uVar7 = 0x10 << ((char)uVar5 * '\x02' & 0x1fU);
    if (0x3f < uVar7) {
      uVar7 = 0x40;
    }
    iVar8 = uVar7 + (uVar7 == 0);
    uVar7 = 0;
    do {
      bVar1 = BitStreamReader::getBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
      if (bVar1) {
        iVar6 = iVar8;
        if (1 < uVar5) {
          uVar2 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
          uVar3 = uVar2 + 1 >> 1;
          if ((uVar2 & 1) == 0) {
            uVar3 = -(uVar2 >> 1);
          }
          if (0xfe < uVar3 + 7) {
            return uVar4;
          }
        }
        do {
          uVar2 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
          uVar3 = uVar2 + 1 >> 1;
          if ((uVar2 & 1) == 0) {
            uVar3 = -(uVar2 >> 1);
          }
          if ((int)(char)uVar3 != uVar3) {
            return uVar4;
          }
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      else {
        uVar3 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
        if (5 < uVar3) {
          return uVar4;
        }
      }
      uVar7 = uVar7 + (uint)(uVar5 == 3) * 2 + 1;
    } while (uVar7 < 6);
    bVar1 = uVar5 < 3;
    uVar5 = uVar5 + 1;
    uVar4 = (uint)bVar1;
    if (uVar5 == 4) {
      return 0;
    }
  } while( true );
}

Assistant:

int HevcSpsUnit::scaling_list_data()
{
    for (int sizeId = 0; sizeId < 4; sizeId++)
    {
        for (int matrixId = 0; matrixId < 6; matrixId += (sizeId == 3) ? 3 : 1)
        {
            if (!m_reader.getBit())
            {
                if (extractUEGolombCode() > 5)  // scaling_list_pred_matrix_id_delta
                    return 1;
            }
            else
            {
                const int coefNum = FFMIN(64, (1 << (4 + (sizeId << 1))));
                if (sizeId > 1)
                {
                    const int scaling_list_dc_coef = extractSEGolombCode() + 8;
                    if (scaling_list_dc_coef < 1 || scaling_list_dc_coef > 255)
                        return 1;
                }
                for (int i = 0; i < coefNum; i++)
                {
                    const int scaling_list_delta_coef = extractSEGolombCode();
                    if (scaling_list_delta_coef < -128 || scaling_list_delta_coef > 127)
                        return 1;
                }
            }
        }
    }
    return 0;
}